

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O2

void __thiscall
TPZVec<TPZEqnArray<long_double>_>::TPZVec
          (TPZVec<TPZEqnArray<long_double>_> *this,initializer_list<TPZEqnArray<long_double>_> *list
          )

{
  ulong uVar1;
  undefined1 auVar2 [16];
  void *pvVar3;
  size_type sVar4;
  TPZEqnArray<long_double> *this_00;
  ulong uVar5;
  iterator pTVar6;
  long lVar7;
  TPZEqnArray<long_double> *this_01;
  
  this->_vptr_TPZVec = (_func_int **)&PTR__TPZVec_017c3ba8;
  this->fStore = (TPZEqnArray<long_double> *)0x0;
  uVar1 = list->_M_len;
  if (uVar1 == 0) {
    this_00 = (TPZEqnArray<long_double> *)0x0;
    sVar4 = 0;
  }
  else {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar1;
    uVar5 = 0xffffffffffffffff;
    if (SUB168(auVar2 * ZEXT816(0x51e0),8) == 0) {
      uVar5 = SUB168(auVar2 * ZEXT816(0x51e0),0) | 0x10;
    }
    pvVar3 = operator_new__(uVar5);
    *(ulong *)((long)pvVar3 + 8) = uVar1;
    this_00 = (TPZEqnArray<long_double> *)((long)pvVar3 + 0x10);
    lVar7 = 0;
    this_01 = this_00;
    do {
      TPZEqnArray<long_double>::TPZEqnArray(this_01);
      lVar7 = lVar7 + -0x51e0;
      this_01 = this_01 + 1;
    } while (uVar1 * -0x51e0 - lVar7 != 0);
    this->fStore = this_00;
    sVar4 = list->_M_len;
  }
  pTVar6 = list->_M_array;
  for (lVar7 = sVar4 * 0x51e0; lVar7 != 0; lVar7 = lVar7 + -0x51e0) {
    TPZEqnArray<long_double>::operator=(this_00,pTVar6);
    pTVar6 = pTVar6 + 1;
    this_00 = this_00 + 1;
  }
  this->fNElements = uVar1;
  this->fNAlloc = uVar1;
  return;
}

Assistant:

TPZVec<T>::TPZVec(const std::initializer_list<T>& list) : fStore(nullptr) {
    const auto size = list.size();
	if (size > 0)
		fStore = new T[size];

	auto it = list.begin();
	auto it_end = list.end();
	T* aux = fStore;
	for (; it != it_end; it++, aux++)
		*aux = *it;

	fNElements = size;
    fNAlloc = size;
}